

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

int ly_vlog_build_path(LY_VLOG_ELEM elem_type,void *elem,char **path,int schema_all_prefixes,
                      int data_no_last_predicate)

{
  hash_table *__s;
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  LYS_NODE LVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  lys_node *plVar9;
  lys_node *plVar10;
  lys_module *plVar11;
  lys_module *plVar12;
  lys_node *node;
  char *pcVar13;
  char *pcVar14;
  size_t sVar15;
  uint16_t str_len;
  char *pcVar16;
  long lVar17;
  ulong uVar18;
  lys_iffeature **pplVar19;
  lys_module *local_70;
  char *local_48;
  uint16_t local_34;
  uint16_t local_32 [3];
  uint16_t index;
  uint16_t length;
  
  local_32[0] = 0;
  pcVar8 = (char *)malloc(1);
  *path = pcVar8;
  if (pcVar8 == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_vlog_build_path");
LAB_0010f8d6:
    iVar7 = -1;
  }
  else {
    local_34 = 0;
    if (elem != (void *)0x0) {
      if (3 < elem_type - LY_VLOG_XML) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/log.c"
               ,0x327);
        goto LAB_0010f8d6;
      }
      local_70 = (lys_module *)0x0;
      plVar10 = (lys_node *)0x0;
      bVar2 = false;
      node = (lys_node *)elem;
      do {
        if (elem_type == LY_VLOG_LYD) {
          pcVar8 = *(char **)node->name;
          if (node->iffeature == (lys_iffeature *)0x0) {
LAB_0010f24a:
            plVar11 = lyd_node_module((lyd_node *)node);
            local_48 = plVar11->name;
          }
          else {
            plVar11 = lyd_node_module((lyd_node *)node);
            plVar12 = lyd_node_module((lyd_node *)node->iffeature);
            if (plVar11 != plVar12) goto LAB_0010f24a;
            local_48 = (char *)0x0;
          }
          if ((data_no_last_predicate == 0) || (local_34 != 0)) {
            pcVar14 = node->name;
            if (*(int *)(pcVar14 + 0x38) == 8) {
              if (*(char **)&node->nodetype != (char *)0x0) {
                pcVar14 = strchr(*(char **)&node->nodetype,0x27);
                pcVar13 = "\"]";
                if (pcVar14 == (char *)0x0) {
                  pcVar13 = "\']";
                }
                pcVar16 = "[.=\"";
                if (pcVar14 == (char *)0x0) {
                  pcVar16 = "[.=\'";
                }
                iVar7 = ly_vlog_build_path_print(path,&local_34,pcVar13,2,local_32);
                if (iVar7 != 0) {
                  return -1;
                }
                pcVar14 = *(char **)&node->nodetype;
                sVar15 = strlen(pcVar14);
                iVar7 = ly_vlog_build_path_print(path,&local_34,pcVar14,(uint16_t)sVar15,local_32);
                if (iVar7 != 0) {
                  return -1;
                }
                str_len = 4;
LAB_0010f6e3:
                iVar7 = ly_vlog_build_path_print(path,&local_34,pcVar16,str_len,local_32);
                if (iVar7 != 0) {
                  return -1;
                }
              }
            }
            else if (*(int *)(pcVar14 + 0x38) == 0x10) {
              uVar18 = (ulong)(byte)pcVar14[0x1e];
              if (uVar18 == 0) {
                uVar5 = lyd_list_pos((lyd_node *)node);
                lVar17 = 1;
                uVar6 = uVar5;
                if (9 < (int)uVar5) {
                  do {
                    lVar17 = lVar17 + 1;
                    bVar1 = 99 < uVar6;
                    uVar6 = uVar6 / 10;
                  } while (bVar1);
                }
                iVar7 = ly_vlog_build_path_print(path,&local_34,"]",1,local_32);
                if (iVar7 != 0) {
                  return -1;
                }
                pcVar14 = (char *)malloc(lVar17 + 1);
                if (pcVar14 == (char *)0x0) {
                  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "ly_vlog_build_path");
                  return -1;
                }
                sprintf(pcVar14,"%d",uVar5);
                iVar7 = ly_vlog_build_path_print(path,&local_34,pcVar14,(uint16_t)lVar17,local_32);
                free(pcVar14);
                if (iVar7 != 0) {
                  return -1;
                }
                pcVar16 = "[";
                str_len = 1;
                goto LAB_0010f6e3;
              }
              do {
                plVar9 = node->parent;
                if (plVar9 != (lys_node *)0x0) {
                  do {
                    if ((lys_node *)plVar9->name ==
                        *(lys_node **)(*(long *)(pcVar14 + 0x88) + (uVar18 - 1) * 8)) {
                      if (*(hash_table **)&plVar9->nodetype != (hash_table *)0x0) {
                        pcVar13 = strchr((char *)*(hash_table **)&plVar9->nodetype,0x27);
                        pcVar16 = "\"]";
                        if (pcVar13 == (char *)0x0) {
                          pcVar16 = "\']";
                        }
                        pcVar3 = "[.=\"";
                        if (pcVar13 == (char *)0x0) {
                          pcVar3 = "[.=\'";
                        }
                        iVar7 = ly_vlog_build_path_print(path,&local_34,pcVar16,2,local_32);
                        if (iVar7 != 0) {
                          return -1;
                        }
                        __s = *(hash_table **)&plVar9->nodetype;
                        sVar15 = strlen((char *)__s);
                        iVar7 = ly_vlog_build_path_print
                                          (path,&local_34,(char *)__s,(uint16_t)sVar15,local_32);
                        if (iVar7 != 0) {
                          return -1;
                        }
                        iVar7 = ly_vlog_build_path_print(path,&local_34,pcVar3 + 2,2,local_32);
                        if (iVar7 != 0) {
                          return -1;
                        }
                        pcVar13 = ((lys_node *)plVar9->name)->name;
                        sVar15 = strlen(pcVar13);
                        iVar7 = ly_vlog_build_path_print
                                          (path,&local_34,pcVar13,(uint16_t)sVar15,local_32);
                        if (iVar7 != 0) {
                          return -1;
                        }
                        plVar11 = lyd_node_module((lyd_node *)node);
                        plVar12 = lyd_node_module((lyd_node *)plVar9);
                        if (plVar11 != plVar12) {
                          iVar7 = ly_vlog_build_path_print(path,&local_34,":",1,local_32);
                          if (iVar7 != 0) {
                            return -1;
                          }
                          plVar11 = lyd_node_module((lyd_node *)plVar9);
                          sVar15 = strlen(plVar11->name);
                          plVar11 = lyd_node_module((lyd_node *)plVar9);
                          iVar7 = ly_vlog_build_path_print
                                            (path,&local_34,plVar11->name,(uint16_t)sVar15,local_32)
                          ;
                          if (iVar7 != 0) {
                            return -1;
                          }
                        }
                        iVar7 = ly_vlog_build_path_print(path,&local_34,"[",1,local_32);
                        if (iVar7 != 0) {
                          return -1;
                        }
                      }
                      break;
                    }
                    plVar9 = *(lys_node **)&plVar9->flags;
                  } while (plVar9 != (lys_node *)0x0);
                }
                bVar1 = 1 < (long)uVar18;
                uVar18 = uVar18 - 1;
              } while (bVar1);
            }
          }
          pplVar19 = &node->iffeature;
          if ((*pplVar19 == (lys_iffeature *)0x0) &&
             (plVar11 = (lys_module *)lyp_get_yang_data_template_name((lyd_node *)node),
             plVar11 != (lys_module *)0x0)) {
            sVar15 = strlen(pcVar8);
            iVar7 = ly_vlog_build_path_print(path,&local_34,pcVar8,(uint16_t)sVar15,local_32);
            if (iVar7 != 0) {
              return -1;
            }
            bVar2 = true;
            iVar7 = ly_vlog_build_path_print(path,&local_34,"/",1,local_32);
            pcVar8 = (char *)plVar11;
            if (iVar7 != 0) {
              return -1;
            }
          }
LAB_0010f77a:
          node = (lys_node *)*pplVar19;
        }
        else {
          if (elem_type != LY_VLOG_LYS) {
            if (elem_type == LY_VLOG_XML) {
              if (*(long *)&node->nodetype == 0) {
                local_48 = (char *)0x0;
              }
              else {
                local_48 = *(char **)(*(long *)&node->nodetype + 0x18);
              }
              pcVar8 = (char *)node->module;
LAB_0010f2fb:
              pplVar19 = (lys_iffeature **)&node->dsc;
              goto LAB_0010f77a;
            }
            sVar15 = strlen((char *)elem);
            iVar7 = ly_vlog_build_path_print(path,&local_34,(char *)elem,(uint16_t)sVar15,local_32);
LAB_0010f934:
            if (iVar7 != 0) {
              return -1;
            }
            break;
          }
          if (local_70 == (lys_module *)0x0) {
            plVar9 = lys_parent(node);
            plVar10 = node;
            while (plVar9 != (lys_node *)0x0) {
              plVar10 = lys_parent(plVar10);
              plVar9 = lys_parent(plVar10);
            }
            local_70 = lys_node_module(plVar10);
          }
          for (plVar10 = lys_parent(node); plVar10 != (lys_node *)0x0; plVar10 = lys_parent(plVar10)
              ) {
            if (plVar10->nodetype != LYS_USES) {
              plVar11 = lys_node_module(node);
              if ((schema_all_prefixes != 0) || (plVar11 != local_70)) goto LAB_0010f182;
              local_48 = (char *)0x0;
              goto LAB_0010f192;
            }
          }
          plVar10 = (lys_node *)0x0;
LAB_0010f182:
          plVar11 = lys_node_module(node);
          local_48 = plVar11->name;
LAB_0010f192:
          LVar4 = node->nodetype;
          if ((LVar4 & (LYS_AUGMENT|LYS_GROUPING)) == LYS_UNKNOWN) {
            pcVar8 = node->name;
            if (LVar4 != LYS_EXT) goto LAB_0010f2aa;
            pcVar8 = (char *)((lys_module *)pcVar8)->ctx;
            iVar7 = strcmp(pcVar8,"yang-data");
            if (iVar7 == 0) {
              pcVar8 = node->ref;
              plVar11 = lys_node_module(node);
              local_48 = plVar11->name;
              LVar4 = node->nodetype;
              bVar2 = true;
              goto LAB_0010f2aa;
            }
LAB_0010f2b1:
            if (node->padding[1] == '\x01') goto LAB_0010f2fb;
            plVar10 = (lys_node *)0x0;
            node = (lys_node *)0x0;
            goto LAB_0010f77d;
          }
          iVar7 = ly_vlog_build_path_print(path,&local_34,"]",1,local_32);
          if (iVar7 != 0) goto LAB_0010f8d6;
          pcVar8 = node->name;
          sVar15 = strlen(pcVar8);
          iVar7 = ly_vlog_build_path_print(path,&local_34,pcVar8,(uint16_t)sVar15,local_32);
          if (iVar7 != 0) {
            return -1;
          }
          LVar4 = node->nodetype;
          pcVar8 = "{augment}[";
          if (LVar4 == LYS_GROUPING) {
            pcVar8 = "{grouping}[";
          }
LAB_0010f2aa:
          if (LVar4 == LYS_EXT) goto LAB_0010f2b1;
          do {
            plVar10 = node->parent;
            node = lys_parent(node);
            if (node == (lys_node *)0x0) {
              node = (lys_node *)0x0;
              break;
            }
          } while (node->nodetype == LYS_USES);
        }
LAB_0010f77d:
        if ((lys_module *)pcVar8 != (lys_module *)0x0) {
          sVar15 = strlen(pcVar8);
          iVar7 = ly_vlog_build_path_print(path,&local_34,pcVar8,(uint16_t)sVar15,local_32);
          if (iVar7 != 0) {
            return -1;
          }
          if (local_48 != (char *)0x0) {
            if (((bVar2) &&
                (iVar7 = ly_vlog_build_path_print(path,&local_34,"#",1,local_32), iVar7 != 0)) ||
               (iVar7 = ly_vlog_build_path_print(path,&local_34,":",1,local_32), iVar7 != 0))
            goto LAB_0010f8d6;
            sVar15 = strlen(local_48);
            iVar7 = ly_vlog_build_path_print(path,&local_34,local_48,(uint16_t)sVar15,local_32);
            if (iVar7 != 0) {
              return -1;
            }
          }
        }
        iVar7 = ly_vlog_build_path_print(path,&local_34,"/",1,local_32);
        if (iVar7 != 0) {
          return -1;
        }
        if (((elem_type == LY_VLOG_LYS) && (node == (lys_node *)0x0)) &&
           (plVar10 != (lys_node *)0x0)) {
          if (plVar10->nodetype == LYS_AUGMENT) {
            pcVar8 = plVar10->name;
            sVar15 = strlen(pcVar8);
            iVar7 = ly_vlog_build_path_print(path,&local_34,pcVar8,(uint16_t)sVar15,local_32);
            goto LAB_0010f934;
          }
          break;
        }
      } while (node != (lys_node *)0x0);
    }
    uVar18 = (ulong)local_32[0];
    memmove(*path,*path + local_34,uVar18);
    (*path)[uVar18] = '\0';
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int
ly_vlog_build_path(enum LY_VLOG_ELEM elem_type, const void *elem, char **path, int schema_all_prefixes, int data_no_last_predicate)
{
    int i, j, yang_data_extension = 0;
    struct lys_node_list *slist;
    struct lys_node *sparent = NULL;
    struct lyd_node *dlist, *diter;
    const struct lys_module *top_smodule = NULL;
    const char *name, *prefix = NULL, *val_end, *val_start, *ext_name;
    char *str;
    uint16_t length, index;
    size_t len;

    length = 0;
    *path = malloc(1);
    LY_CHECK_ERR_RETURN(!(*path), LOGMEM(NULL), -1);
    index = 0;

    while (elem) {
        switch (elem_type) {
        case LY_VLOG_XML:
            name = ((struct lyxml_elem *)elem)->name;
            prefix = ((struct lyxml_elem *)elem)->ns ? ((struct lyxml_elem *)elem)->ns->prefix : NULL;
            elem = ((struct lyxml_elem *)elem)->parent;
            break;
        case LY_VLOG_LYS:
            if (!top_smodule) {
                /* remember the top module, it will act as the current module */
                for (sparent = (struct lys_node *)elem; lys_parent(sparent); sparent = lys_parent(sparent));
                top_smodule = lys_node_module(sparent);
            }

            /* skip uses */
            sparent = lys_parent((struct lys_node *)elem);
            while (sparent && (sparent->nodetype == LYS_USES)) {
                sparent = lys_parent(sparent);
            }
            if (!sparent || (lys_node_module((struct lys_node *)elem) != top_smodule) || schema_all_prefixes) {
                prefix = lys_node_module((struct lys_node *)elem)->name;
            } else {
                prefix = NULL;
            }

            if (((struct lys_node *)elem)->nodetype & (LYS_AUGMENT | LYS_GROUPING)) {
                if (ly_vlog_build_path_print(path, &index, "]", 1, &length)) {
                    return -1;
                }

                name = ((struct lys_node *)elem)->name;
                if (ly_vlog_build_path_print(path, &index, name, strlen(name), &length)) {
                    return -1;
                }

                if (((struct lys_node *)elem)->nodetype == LYS_GROUPING) {
                    name = "{grouping}[";
                } else { /* augment */
                    name = "{augment}[";
                }
            } else if (((struct lys_node *)elem)->nodetype == LYS_EXT) {
                name = ((struct lys_ext_instance *)elem)->def->name;
                if (!strcmp(name, "yang-data")) {
                    yang_data_extension = 1;
                    name = ((struct lys_ext_instance *)elem)->arg_value;
                    prefix = lys_node_module((struct lys_node *)elem)->name;
                }
            } else {
                name = ((struct lys_node *)elem)->name;
            }

            if (((struct lys_node *)elem)->nodetype == LYS_EXT) {
                if (((struct lys_ext_instance*)elem)->parent_type == LYEXT_PAR_NODE) {
                    elem = (struct lys_node*)((struct lys_ext_instance*)elem)->parent;
                } else {
                    sparent = NULL;
                    elem = NULL;
                }
                break;
            }

            /* need to find the parent again because we don't want to skip augments */
            do {
                sparent = ((struct lys_node *)elem)->parent;
                elem = lys_parent((struct lys_node *)elem);
            } while (elem && (((struct lys_node *)elem)->nodetype == LYS_USES));
            break;
        case LY_VLOG_LYD:
            name = ((struct lyd_node *)elem)->schema->name;
            if (!((struct lyd_node *)elem)->parent ||
                    lyd_node_module((struct lyd_node *)elem) != lyd_node_module(((struct lyd_node *)elem)->parent)) {
                prefix = lyd_node_module((struct lyd_node *)elem)->name;
            } else {
                prefix = NULL;
            }

            /* handle predicates (keys) in case of lists */
            if (!data_no_last_predicate || index) {
                if (((struct lyd_node *)elem)->schema->nodetype == LYS_LIST) {
                    dlist = (struct lyd_node *)elem;
                    slist = (struct lys_node_list *)((struct lyd_node *)elem)->schema;
                    if (slist->keys_size) {
                        /* schema list with keys - use key values in predicates */
                        for (i = slist->keys_size - 1; i > -1; i--) {
                            LY_TREE_FOR(dlist->child, diter) {
                                if (diter->schema == (struct lys_node *)slist->keys[i]) {
                                    break;
                                }
                            }
                            if (diter && ((struct lyd_node_leaf_list *)diter)->value_str) {
                                if (strchr(((struct lyd_node_leaf_list *)diter)->value_str, '\'')) {
                                    val_start = "=\"";
                                    val_end = "\"]";
                                } else {
                                    val_start = "='";
                                    val_end = "']";
                                }

                                /* print value */
                                if (ly_vlog_build_path_print(path, &index, val_end, 2, &length)) {
                                    return -1;
                                }
                                len = strlen(((struct lyd_node_leaf_list *)diter)->value_str);
                                if (ly_vlog_build_path_print(path, &index,
                                        ((struct lyd_node_leaf_list *)diter)->value_str, len, &length)) {
                                    return -1;
                                }

                                /* print schema name */
                                if (ly_vlog_build_path_print(path, &index, val_start, 2, &length)) {
                                    return -1;
                                }
                                len = strlen(diter->schema->name);
                                if (ly_vlog_build_path_print(path, &index, diter->schema->name, len, &length)) {
                                    return -1;
                                }

                                if (lyd_node_module(dlist) != lyd_node_module(diter)) {
                                    if (ly_vlog_build_path_print(path, &index, ":", 1, &length)) {
                                        return -1;
                                    }
                                    len = strlen(lyd_node_module(diter)->name);
                                    if (ly_vlog_build_path_print(path, &index, lyd_node_module(diter)->name, len, &length)) {
                                        return -1;
                                    }
                                }

                                if (ly_vlog_build_path_print(path, &index, "[", 1, &length)) {
                                    return -1;
                                }
                            }
                        }
                    } else {
                        /* schema list without keys - use instance position */
                        i = j = lyd_list_pos(dlist);
                        len = 1;
                        while (j > 9) {
                            ++len;
                            j /= 10;
                        }

                        if (ly_vlog_build_path_print(path, &index, "]", 1, &length)) {
                            return -1;
                        }

                        str = malloc(len + 1);
                        LY_CHECK_ERR_RETURN(!str, LOGMEM(NULL), -1);
                        sprintf(str, "%d", i);

                        if (ly_vlog_build_path_print(path, &index, str, len, &length)) {
                            free(str);
                            return -1;
                        }
                        free(str);

                        if (ly_vlog_build_path_print(path, &index, "[", 1, &length)) {
                            return -1;
                        }
                    }
                } else if (((struct lyd_node *)elem)->schema->nodetype == LYS_LEAFLIST &&
                        ((struct lyd_node_leaf_list *)elem)->value_str) {
                    if (strchr(((struct lyd_node_leaf_list *)elem)->value_str, '\'')) {
                        val_start = "[.=\"";
                        val_end = "\"]";
                    } else {
                        val_start = "[.='";
                        val_end = "']";
                    }

                    if (ly_vlog_build_path_print(path, &index, val_end, 2, &length)) {
                        return -1;
                    }
                    len = strlen(((struct lyd_node_leaf_list *)elem)->value_str);
                    if (ly_vlog_build_path_print(path, &index, ((struct lyd_node_leaf_list *)elem)->value_str, len, &length)) {
                        return -1;
                    }
                    if (ly_vlog_build_path_print(path, &index, val_start, 4, &length)) {
                        return -1;
                    }
                }
            }

            /* check if it is yang-data top element */
            if (!((struct lyd_node *)elem)->parent) {
                ext_name = lyp_get_yang_data_template_name(elem);
                if (ext_name) {
                    if (ly_vlog_build_path_print(path, &index, name, strlen(name), &length)) {
                        return -1;
                    }
                    if (ly_vlog_build_path_print(path, &index, "/", 1, &length)) {
                        return -1;
                    }
                    yang_data_extension = 1;
                    name = ext_name;
               }
            }

            elem = ((struct lyd_node *)elem)->parent;
            break;
        case LY_VLOG_STR:
            len = strlen((const char *)elem);
            if (ly_vlog_build_path_print(path, &index, (const char *)elem, len, &length)) {
                return -1;
            }
            goto success;
        default:
            /* shouldn't be here */
            LOGINT(NULL);
            return -1;
        }
        if (name) {
            if (ly_vlog_build_path_print(path, &index, name, strlen(name), &length)) {
                return -1;
            }
            if (prefix) {
                if (yang_data_extension && ly_vlog_build_path_print(path, &index, "#", 1, &length)) {
                    return -1;
                }
                if (ly_vlog_build_path_print(path, &index, ":", 1, &length)) {
                    return -1;
                }
                if (ly_vlog_build_path_print(path, &index, prefix, strlen(prefix), &length)) {
                    return -1;
                }
            }
        }
        if (ly_vlog_build_path_print(path, &index, "/", 1, &length)) {
            return -1;
        }
        if ((elem_type == LY_VLOG_LYS) && !elem && sparent && (sparent->nodetype == LYS_AUGMENT)) {
            len = strlen(((struct lys_node_augment *)sparent)->target_name);
            if (ly_vlog_build_path_print(path, &index, ((struct lys_node_augment *)sparent)->target_name, len, &length)) {
                return -1;
            }
        }
    }

success:
    memmove(*path, (*path) + index, length);
    (*path)[length] = '\0';
    return 0;
}